

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

tuple<unsigned_int,_int> __thiscall binary::binUvarint(binary *this,Bytes *buf)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  ulong __n;
  
  uVar2 = 0;
  __n = 0;
  bVar4 = 0;
  uVar5 = 0;
  do {
    if ((ulong)((long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= __n) {
      uVar5 = 0;
LAB_0010e243:
      *(uint *)this = uVar5;
      *(uint *)(this + 4) = uVar2;
      return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
    }
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(buf,__n);
    bVar1 = *pbVar3;
    if (-1 < (char)bVar1) {
      if (bVar1 < 2 || __n < 9) {
        uVar2 = (uint)bVar1 << (bVar4 & 0x1f) | uVar5;
        uVar5 = (uint)__n + 1;
      }
      else {
        uVar5 = ~(uint)__n;
        uVar2 = 0;
      }
      goto LAB_0010e243;
    }
    uVar5 = uVar5 | (bVar1 & 0x7f) << (bVar4 & 0x1f);
    bVar4 = bVar4 + 7;
    __n = __n + 1;
  } while( true );
}

Assistant:

std::tuple<UInt, int> binUvarint(const Bytes &buf) {
	UInt x{};
	UInt s{};

	for (int i = 0; i < buf.size(); i++) {
		unsigned char b = buf.at(i);
		if (b < 0x80) {
			if (i >= 9 && b > 1) {
				return {0, -(i + 1)}; // overflow
			}
			return {x | UInt(b) << s, i + 1};
		}
		x |= UInt(b & 0x7f) << s;
		s += 7;
	}
	return {0, 0};
}